

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::DrawCircle
          (AbstractContentContext *this,double inCenterX,double inCenterY,double inRadius,
          GraphicOptions *inOptions)

{
  EStatusCode EVar1;
  char *in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar2;
  undefined4 extraout_EDX_01;
  undefined4 extraout_EDX_02;
  undefined4 extraout_EDX_03;
  undefined4 extraout_EDX_04;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  GraphicOptions *pGVar3;
  int in_R8D;
  int in_R9D;
  double rmagic;
  double r;
  double y;
  double x;
  double magic;
  GraphicOptions *inOptions_local;
  double inRadius_local;
  double inCenterY_local;
  double inCenterX_local;
  AbstractContentContext *this_local;
  
  pGVar3 = inOptions;
  SetupColor(this,inOptions);
  iVar2 = extraout_EDX;
  if (inOptions->drawingType == eStroke) {
    w(this,inOptions->strokeWidth);
    iVar2 = extraout_EDX_00;
  }
  m(this,pGVar3,iVar2,in_RCX,in_R8D,in_R9D);
  c(this,pGVar3,(void *)CONCAT44(extraout_var,extraout_EDX_01));
  c(this,pGVar3,(void *)CONCAT44(extraout_var_00,extraout_EDX_02));
  c(this,pGVar3,(void *)CONCAT44(extraout_var_01,extraout_EDX_03));
  c(this,pGVar3,(void *)CONCAT44(extraout_var_02,extraout_EDX_04));
  FinishPath(this,inOptions);
  EVar1 = GetCurrentStatusCode(this);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::DrawCircle(double inCenterX,double inCenterY,double inRadius,const GraphicOptions& inOptions)
{
    const double magic = 0.551784;
    double x = inCenterX;
    double y = inCenterY;
    double r = inRadius;
    double rmagic = r * magic;
    
	SetupColor(inOptions);
	if(inOptions.drawingType == eStroke)
		w(inOptions.strokeWidth);
    m(x-r,y);
    c(x-r,y+rmagic,x-rmagic,y+r,x,y+r);
    c(x+rmagic,y+r,x+r,y+rmagic,x+r,y);
    c(x+r,y-rmagic,x+rmagic,y-r,x,y-r);
    c(x-rmagic,y-r,x-r,y-rmagic,x-r,y);
	FinishPath(inOptions);	
	return GetCurrentStatusCode();
}